

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O1

void spot_moveCards(Spot *fromSpot,uchar fromCardsIndex,uchar cardsToMoveCount,Spot *toSpot,
                   uchar toCardsIndex,_Bool reverseCards)

{
  byte bVar1;
  Card **ppCVar2;
  undefined7 in_register_00000011;
  char cVar3;
  
  bVar1 = toSpot->cardsCount;
  ppCVar2 = (Card **)realloc(toSpot->cards,
                             (ulong)(((uint)bVar1 +
                                     (int)CONCAT71(in_register_00000011,cardsToMoveCount)) * 8));
  toSpot->cards = ppCVar2;
  if (bVar1 <= toCardsIndex) {
    memcpy(ppCVar2 + toCardsIndex,fromSpot->cards + fromCardsIndex,
           (ulong)((uint)cardsToMoveCount * 8));
    if (reverseCards) {
      cards_reverse(ppCVar2 + toCardsIndex,cardsToMoveCount);
    }
    toSpot->cardsCount = toSpot->cardsCount + cardsToMoveCount;
    bVar1 = fromSpot->cardsCount - cardsToMoveCount;
    fromSpot->cardsCount = bVar1;
    ppCVar2 = (Card **)realloc(fromSpot->cards,(ulong)bVar1 << 3);
    fromSpot->cards = ppCVar2;
    return;
  }
  cVar3 = bVar1 - toCardsIndex;
  if (bVar1 < toCardsIndex) {
    cVar3 = '\0';
  }
  printf("TODO!! INSERTING cards, so displacing %d cards in destination\n",cVar3);
  exit(1);
}

Assistant:

void spot_moveCards(Spot * fromSpot, unsigned char fromCardsIndex, unsigned char cardsToMoveCount, Spot * toSpot, unsigned char toCardsIndex, bool reverseCards)
{
	unsigned char displacedCardsCount = toSpot->cardsCount>0 && toCardsIndex<toSpot->cardsCount ? toSpot->cardsCount-toCardsIndex : 0;
	//printf("%d from %s%d %d to %s%d %d\n", cardsToMoveCount, fromSpot->name, fromSpot->index, fromCardsIndex, toSpot->name, toSpot->index, toCardsIndex);

	toSpot->cards = (Card **)realloc(toSpot->cards, sizeof(Card *)*(cardsToMoveCount+toSpot->cardsCount));
	if(displacedCardsCount>0)
	{
		printf("TODO!! INSERTING cards, so displacing %d cards in destination\n", displacedCardsCount);
		exit(EXIT_FAILURE);
		//memcpy(toSpot->cards+(sizeof(Card *)*((toSpot->cardsCount-toCardsIndex)+cardsToMoveCount)), toSpot->cards+(sizeof(Card *)*(toSpot->cardsCount-toCardsIndex)));
	}

	memcpy(&toSpot->cards[toCardsIndex], &fromSpot->cards[fromCardsIndex], sizeof(Card *)*cardsToMoveCount);
	if(reverseCards)
		cards_reverse(&toSpot->cards[toCardsIndex], cardsToMoveCount);
	toSpot->cardsCount+=cardsToMoveCount;

	fromSpot->cardsCount-=cardsToMoveCount;
	fromSpot->cards = (Card **)realloc(fromSpot->cards, sizeof(Card *)*fromSpot->cardsCount);
}